

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

uint ndiHexToUnsignedInt(char *string,int n)

{
  int iVar1;
  uint local_1c;
  int c;
  uint result;
  int i;
  int n_local;
  char *string_local;
  
  local_1c = 0;
  c = 0;
  do {
    if (n <= c) {
      return local_1c;
    }
    iVar1 = (int)string[c];
    if ((iVar1 < 0x61) || (0x66 < iVar1)) {
      if ((iVar1 < 0x41) || (0x46 < iVar1)) {
        if (iVar1 < 0x30) {
          return local_1c;
        }
        if (0x39 < iVar1) {
          return local_1c;
        }
        local_1c = local_1c << 4 | iVar1 - 0x30U;
      }
      else {
        local_1c = local_1c << 4 | iVar1 - 0x37U;
      }
    }
    else {
      local_1c = local_1c << 4 | iVar1 - 0x57U;
    }
    c = c + 1;
  } while( true );
}

Assistant:

ndicapiExport unsigned int ndiHexToUnsignedInt(const char* string, int n)
{
  int i;
  unsigned int result = 0;
  int c;

  for (i = 0; i < n; i++)
  {
    c = string[i];
    if (c >= 'a' && c <= 'f')
    {
      result = (result << 4) | (c + (10 - 'a'));
    }
    else if (c >= 'A' && c <= 'F')
    {
      result = (result << 4) | (c + (10 - 'A'));
    }
    else if (c >= '0' && c <= '9')
    {
      result = (result << 4) | (c - '0');
    }
    else
    {
      break;
    }
  }

  return result;
}